

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

string<char> __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,string<char> *origstr)

{
  bool bVar1;
  _func_int **pp_Var2;
  int iVar3;
  uint uVar4;
  string<char> *in_RDX;
  ulong extraout_RDX;
  ulong uVar5;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  s32 begin;
  int iVar9;
  ulong uVar10;
  long lVar11;
  string<char> sVar12;
  string<char> local_50;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *local_40;
  ulong local_38;
  
  uVar7 = (ulong)in_RDX->used;
  if (0 < (long)uVar7) {
    uVar10 = 0;
    do {
      if (in_RDX->array[uVar10] == '&') {
        this->TextData = (char *)0x100000001;
        pp_Var2 = (_func_int **)operator_new__(1);
        (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var2;
        *(undefined1 *)pp_Var2 = 0;
        uVar5 = 0;
        local_40 = this;
        goto LAB_00644c9a;
      }
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = (_func_int **)0x0;
  this->TextData = (char *)0x0;
  core::string<char>::operator=((string<char> *)this,in_RDX);
  uVar5 = extraout_RDX;
LAB_00644c63:
  sVar12.allocated = (int)uVar5;
  sVar12.used = (int)(uVar5 >> 0x20);
  sVar12.array = (char *)this;
  return sVar12;
LAB_00644c9a:
  uVar6 = (uint)uVar7;
  iVar9 = (int)uVar10;
  begin = (s32)in_RDX;
  if ((int)(uVar6 - 3) <= iVar9) goto LAB_00644db7;
  local_38 = uVar5;
  if (0 < *(int *)((long)&origstr[6].array + 4)) {
    lVar8 = 0;
    lVar11 = 0;
    do {
      bVar1 = equalsn((CXMLReaderImpl<char,_irr::io::IXMLBase> *)origstr,
                      (char *)(*(long *)(*(long *)&origstr[5].allocated + lVar8) + 1),
                      in_RDX->array + (long)iVar9 + 1,
                      *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar8) + -2);
      if (bVar1) {
        core::string<char>::subString(&local_50,begin,(s32)local_38);
        this = local_40;
        core::string<char>::append((string<char> *)local_40,&local_50);
        if (local_50.array != (char *)0x0) {
          operator_delete__(local_50.array);
        }
        core::string<char>::append
                  ((string<char> *)this,**(char **)(*(long *)&origstr[5].allocated + lVar8));
        iVar3 = *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar8) + -1;
        goto LAB_00644d8a;
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar11 < *(int *)((long)&origstr[6].array + 4));
  }
  core::string<char>::subString(&local_50,begin,(s32)local_38);
  this = local_40;
  core::string<char>::append((string<char> *)local_40,&local_50);
  if (local_50.array != (char *)0x0) {
    operator_delete__(local_50.array);
  }
  iVar3 = 1;
LAB_00644d8a:
  uVar4 = iVar3 + iVar9;
  uVar5 = (ulong)uVar4;
  uVar6 = in_RDX->used;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 <= (int)uVar4) goto LAB_00644db7;
  uVar10 = (ulong)(int)uVar4;
  while (in_RDX->array[uVar10] != '&') {
    uVar10 = uVar10 + 1;
    if (uVar6 == (uint)uVar10) goto LAB_00644db7;
  }
  if (uVar10 == 0xffffffffffffffff) goto LAB_00644db7;
  goto LAB_00644c9a;
LAB_00644db7:
  if ((s32)uVar5 < (int)(uVar6 - 2)) {
    core::string<char>::subString(&local_50,begin,(s32)uVar5);
    core::string<char>::append((string<char> *)this,&local_50);
    uVar5 = extraout_RDX_00;
    if (local_50.array != (char *)0x0) {
      operator_delete__(local_50.array);
      uVar5 = extraout_RDX_01;
    }
  }
  goto LAB_00644c63;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}